

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O2

void __thiscall
JsrtDebuggerObjectFunction::~JsrtDebuggerObjectFunction(JsrtDebuggerObjectFunction *this)

{
  ~JsrtDebuggerObjectFunction(this);
  operator_delete(this);
  return;
}

Assistant:

JsrtDebuggerObjectFunction::~JsrtDebuggerObjectFunction()
{
    if (this->objectDisplay != nullptr)
    {
        HeapDelete(this->objectDisplay);
        this->objectDisplay = nullptr;
    }

    if (this->walkerRef != nullptr)
    {
        HeapDelete(this->walkerRef);
        this->walkerRef = nullptr;
    }

    this->javascriptFunction = nullptr;
}